

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O2

void Cnf_DataPrint(Cnf_Dat_t *p,int fReadable)

{
  int **ppiVar1;
  uint uVar2;
  uint *puVar3;
  uint uVar4;
  FILE *__stream;
  uint uVar5;
  uint *puVar6;
  long lVar7;
  
  __stream = _stdout;
  fprintf(_stdout,"p cnf %d %d\n",(ulong)(uint)p->nVars,(ulong)(uint)p->nClauses);
  lVar7 = 0;
  while (lVar7 < p->nClauses) {
    ppiVar1 = p->pClauses + lVar7;
    puVar3 = (uint *)p->pClauses[lVar7 + 1];
    lVar7 = lVar7 + 1;
    for (puVar6 = (uint *)*ppiVar1; puVar6 < puVar3; puVar6 = puVar6 + 1) {
      uVar2 = *puVar6;
      uVar5 = (int)uVar2 >> 1;
      if (fReadable == 0) {
        uVar4 = ~uVar5;
        if ((uVar2 & 1) == 0) {
          uVar4 = uVar5 + 1;
        }
      }
      else {
        uVar4 = -uVar5;
        if ((uVar2 & 1) == 0) {
          uVar4 = uVar5;
        }
      }
      fprintf(__stream,"%d ",(ulong)uVar4);
    }
    fputc(10,__stream);
  }
  fputc(10,__stream);
  return;
}

Assistant:

void Cnf_DataPrint( Cnf_Dat_t * p, int fReadable )
{
    FILE * pFile = stdout;
    int * pLit, * pStop, i;
    fprintf( pFile, "p cnf %d %d\n", p->nVars, p->nClauses );
    for ( i = 0; i < p->nClauses; i++ )
    {
        for ( pLit = p->pClauses[i], pStop = p->pClauses[i+1]; pLit < pStop; pLit++ )
            fprintf( pFile, "%d ", fReadable? Cnf_Lit2Var2(*pLit) : Cnf_Lit2Var(*pLit) );
        fprintf( pFile, "\n" );
    }
    fprintf( pFile, "\n" );
}